

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O1

int substrcmp(char *text,char *pat,size_t len)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  
  cVar2 = *pat;
  cVar3 = *text;
  if (cVar2 == '\0') {
    uVar5 = (uint)(cVar3 == '\0');
  }
  else {
    uVar5 = 1;
    while (cVar3 != '\0') {
      if ((cVar3 == cVar2) && (iVar4 = strncmp(text,pat,len), iVar4 == 0)) {
        return 0;
      }
      pcVar1 = text + 1;
      text = text + 1;
      cVar3 = *pcVar1;
    }
  }
  return uVar5;
}

Assistant:

static int substrcmp(const char *text, const char *pat, size_t len)
{
    char c;

    if ((c = *pat) == '\0')
        return *text == '\0';

    for ( ; *text; text++) {
        if (*text == c && strncmp(text, pat, len) == 0)
            return 0;
    }

    return 1;
}